

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O3

int __thiscall
CRegexSearcher::search
          (CRegexSearcher *this,char *entirestr,char *str,size_t len,
          re_compiled_pattern_base *pattern,re_tuple *tuple_arr,re_machine *machine,
          re_group_register *regs,int *result_len)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  re_group_register *prVar7;
  re_group_register *prVar8;
  byte *str_00;
  byte bVar9;
  int local_d8;
  short loop_vars [20];
  re_group_register best_match_regs [10];
  
  bVar9 = 0;
  pbVar5 = (byte *)(str + len);
  lVar3 = len - (long)entirestr;
  iVar4 = -1;
  uVar6 = 0xffffffff;
  str_00 = (byte *)str;
  while( true ) {
    uVar1 = match(this,entirestr,(size_t)(str + lVar3),(char *)str_00,len,pattern,tuple_arr,machine,
                  regs,loop_vars);
    if (-1 < (int)uVar1) {
      local_d8 = (int)str;
      local_d8 = (int)str_00 - local_d8;
      if ((pattern->field_0x14 & 8) != 0) {
        *result_len = uVar1;
        return local_d8;
      }
      if (((uVar6 == 0xffffffff) || ((int)(uVar1 + local_d8) < (int)(iVar4 + uVar6))) ||
         ((pattern->field_0x14 & 4) == 0 && uVar1 + local_d8 == iVar4 + uVar6)) {
        prVar7 = regs;
        prVar8 = best_match_regs;
        for (lVar2 = 0x14; lVar2 != 0; lVar2 = lVar2 + -1) {
          prVar8->start_ofs = prVar7->start_ofs;
          prVar7 = (re_group_register *)&prVar7[-(ulong)bVar9].end_ofs;
          prVar8 = (re_group_register *)&prVar8[-(ulong)bVar9].end_ofs;
        }
        pbVar5 = str_00 + uVar1;
        uVar6 = uVar1;
        iVar4 = local_d8;
      }
    }
    if (str_00 == pbVar5) break;
    len = (size_t)(str_00 + (len - (long)(str_00 + (ulong)(((*str_00 >> 5 & 1) != 0) + 1 &
                                                          (uint)(*str_00 >> 7) * 3) + 1)));
    str_00 = str_00 + (ulong)(((*str_00 >> 5 & 1) != 0) + 1 & (uint)(*str_00 >> 7) * 3) + 1;
  }
  if (uVar6 == 0xffffffff) {
    iVar4 = -1;
  }
  else {
    *result_len = uVar6;
    prVar7 = best_match_regs;
    for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
      regs->start_ofs = prVar7->start_ofs;
      prVar7 = (re_group_register *)&prVar7[-(ulong)bVar9].end_ofs;
      regs = (re_group_register *)&regs[-(ulong)bVar9].end_ofs;
    }
  }
  return iVar4;
}

Assistant:

int CRegexSearcher::search(const char *entirestr, const char *str, size_t len,
                           const re_compiled_pattern_base *pattern,
                           const re_tuple *tuple_arr,
                           const re_machine *machine, re_group_register *regs,
                           int *result_len)
{
    re_group_register best_match_regs[RE_GROUP_REG_CNT];
    short loop_vars[RE_LOOP_VARS_MAX];

    /* we don't have a match yet */
    int best_match_len = -1;
    int best_match_start = -1;

    /* search the entire string */
    const char *max_start_pos = str + len;

    /* figure the length of the overall string */
    size_t entirelen = len + (str - entirestr);
    
    /*
     *   Starting at the first character in the string, search for the
     *   pattern at each subsequent character until we either find the
     *   pattern or run out of string to test. 
     */
    utf8_ptr p;
    for (p.set((char *)str) ; ; )
    {
        /* check for a match */
        int matchlen = match(entirestr, entirelen, p.getptr(), len,
                             pattern, tuple_arr, machine, regs, loop_vars);
        if (matchlen >= 0)
        {
            /* check our first-begin/first-end mode */
            if (pattern->first_begin)
            {
                /*   
                 *   We're in first-begin mode: return immediately,
                 *   because we want to find the match that starts at the
                 *   earliest point in the string; having found a match
                 *   here, there's no point in looking for a later match,
                 *   since it obviously won't start any earlier than this
                 *   one does.  
                 */
                *result_len = matchlen;
                return p.getptr() - str;
            }
            else
            {
                int keep;
                
                /*
                 *   We're in first-end mode.  We can't return yet,
                 *   because we might find something that ends before this
                 *   string does.
                 *   
                 *   If this is the first or best match so far, note it;
                 *   otherwise, ignore it.  In any case, continue looking.
                 */
                if (best_match_len == -1)
                {
                    /* 
                     *   this is our first match - it's definitely the
                     *   best so far 
                     */
                    keep = TRUE;
                }
                else
                {
                    /* calculate the ending index of this match */
                    int end_idx = (p.getptr() - str) + matchlen;

                    /* see what we have */
                    if (end_idx < best_match_start + best_match_len)
                    {
                        /* 
                         *   this one ends earlier than the previous best
                         *   match so far -- we definitely want to keep
                         *   this one 
                         */
                        keep = TRUE;
                    }
                    else if (end_idx == best_match_start + best_match_len)
                    {
                        /* 
                         *   This one ends at exactly the same point as
                         *   our best match so far.  Decide which one to
                         *   keep based on the lengths.  If we're in
                         *   longest-match mode, keep the longer one,
                         *   otherwise keep the shorter one. 
                         */
                        if (pattern->longest_match)
                        {
                            /* 
                             *   longest-match mode - keep the old one,
                             *   since it's longer (it starts earlier and
                             *   ends at the same point) 
                             */
                            keep = FALSE;
                        }
                        else
                        {
                            /* 
                             *   shortest-match mode - keep the new one,
                             *   since it's shorter (it starts later and
                             *   ends at the same point) 
                             */
                            keep = TRUE;
                        }
                    }
                    else
                    {
                        /* 
                         *   this one isn't as good as the previous best
                         *   -- ignore this one and keep our previous
                         *   winner 
                         */
                        keep = FALSE;
                    }
                }
                
                /* if we're keeping this match, save it */
                if (keep)
                {
                    /* save the start index, length, and register contents */
                    best_match_start = p.getptr() - str;
                    best_match_len = matchlen;
                    memcpy(best_match_regs, regs, sizeof(best_match_regs));

                    /*
                     *   There's no point in looking for strings that
                     *   start beyond the end of the current match,
                     *   because they certainly won't end before this
                     *   match ends.  So, adjust our end-of-loop marker to
                     *   point to the next character past the end of our
                     *   match. 
                     */
                    max_start_pos = p.getptr() + matchlen;
                }
            }
		}

		/* stop if we've reached the end of the string */
		if (p.getptr() == max_start_pos)
			break;

		/* advance by one character and try again */
		p.inc(&len);
	}

    /* if we found a previous match, return it */
    if (best_match_len != -1)
    {
        /* set the caller's match length */
        *result_len = best_match_len;

        /* copy the saved match registers into the caller's registers */
        memcpy(regs, best_match_regs, sizeof(best_match_regs));

        /* return the starting index of the match */
        return best_match_start;
    }

    /* we didn't find a match */
    return -1;
}